

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_dlib.cpp
# Opt level: O0

void dlib::cpu::softmax(tensor *dest,tensor *src,operation_mode mode)

{
  bool bVar1;
  ostream *poVar2;
  undefined8 uVar3;
  ostream *poVar4;
  string *a;
  int in_EDX;
  tensor *in_RSI;
  ostringstream dlib_o_out_1;
  ostringstream dlib_o_out;
  string *in_stack_fffffffffffffbe0;
  tensor *in_stack_fffffffffffffbe8;
  error_type eVar5;
  tensor *in_stack_fffffffffffffbf0;
  ostringstream local_340 [383];
  undefined1 local_1c1;
  ostringstream local_190 [132];
  operation_mode in_stack_fffffffffffffef4;
  tensor *in_stack_fffffffffffffef8;
  tensor *in_stack_ffffffffffffff00;
  long in_stack_ffffffffffffff08;
  long in_stack_ffffffffffffff10;
  
  bVar1 = have_same_dimensions(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
  eVar5 = (error_type)((ulong)in_stack_fffffffffffffbe8 >> 0x20);
  if (!bVar1) {
    dlib_assert_breakpoint();
    std::__cxx11::ostringstream::ostringstream(local_190);
    poVar2 = std::operator<<((ostream *)local_190,"\n\nError detected at line ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x6f1);
    std::operator<<(poVar2,".\n");
    poVar2 = std::operator<<((ostream *)local_190,"Error detected in file ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp"
                            );
    std::operator<<(poVar2,".\n");
    poVar2 = std::operator<<((ostream *)local_190,"Error detected in function ");
    poVar2 = std::operator<<(poVar2,
                             "void dlib::cpu::softmax(tensor &, const tensor &, operation_mode)");
    std::operator<<(poVar2,".\n\n");
    poVar2 = std::operator<<((ostream *)local_190,"Failing expression was ");
    poVar2 = std::operator<<(poVar2,"have_same_dimensions(dest, src)");
    std::operator<<(poVar2,".\n");
    poVar2 = (ostream *)std::ostream::operator<<(local_190,std::boolalpha);
    poVar2 = std::operator<<(poVar2,"");
    std::operator<<(poVar2,"\n");
    local_1c1 = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    std::__cxx11::ostringstream::str();
    fatal_error::fatal_error
              ((fatal_error *)in_stack_fffffffffffffbf0,eVar5,in_stack_fffffffffffffbe0);
    local_1c1 = 0;
    __cxa_throw(uVar3,&fatal_error::typeinfo,fatal_error::~fatal_error);
  }
  if ((in_EDX != 0) && (in_EDX != 1)) {
    dlib_assert_breakpoint();
    std::__cxx11::ostringstream::ostringstream(local_340);
    poVar2 = std::operator<<((ostream *)local_340,"\n\nError detected at line ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x6f2);
    std::operator<<(poVar2,".\n");
    poVar2 = std::operator<<((ostream *)local_340,"Error detected in file ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp"
                            );
    std::operator<<(poVar2,".\n");
    poVar2 = std::operator<<((ostream *)local_340,"Error detected in function ");
    poVar2 = std::operator<<(poVar2,
                             "void dlib::cpu::softmax(tensor &, const tensor &, operation_mode)");
    std::operator<<(poVar2,".\n\n");
    poVar2 = std::operator<<((ostream *)local_340,"Failing expression was ");
    poVar2 = std::operator<<(poVar2,
                             "mode == operation_mode::CHANNEL_WISE || mode == operation_mode::PLANE_WISE"
                            );
    std::operator<<(poVar2,".\n");
    poVar4 = (ostream *)std::ostream::operator<<(local_340,std::boolalpha);
    a = (string *)std::operator<<(poVar4,"Invalid softmax mode");
    eVar5 = (error_type)((ulong)poVar4 >> 0x20);
    std::operator<<((ostream *)a,"\n");
    uVar3 = __cxa_allocate_exception(0x30);
    std::__cxx11::ostringstream::str();
    fatal_error::fatal_error((fatal_error *)poVar2,eVar5,a);
    __cxa_throw(uVar3,&fatal_error::typeinfo,fatal_error::~fatal_error);
  }
  tensor::nr(in_RSI);
  tensor::nc(in_RSI);
  tensor::k(in_RSI);
  ttimpl::softmax(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                  in_stack_fffffffffffffef8,in_stack_fffffffffffffef4);
  return;
}

Assistant:

void softmax(
            tensor& dest,
            const tensor& src,
            operation_mode mode
        )
        {
            DLIB_CASSERT(have_same_dimensions(dest, src));
            DLIB_CASSERT(mode == operation_mode::CHANNEL_WISE || mode == operation_mode::PLANE_WISE, "Invalid softmax mode");
            ttimpl::softmax(src.nr() * src.nc(), src.k(), dest, src, mode);
        }